

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::subject::
SubjectFactoryTest_test_setting_fx_swap_stream_with_missing_FarQuantity_and_Tenor_Test::
~SubjectFactoryTest_test_setting_fx_swap_stream_with_missing_FarQuantity_and_Tenor_Test
          (SubjectFactoryTest_test_setting_fx_swap_stream_with_missing_FarQuantity_and_Tenor_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_setting_fx_swap_stream_with_missing_FarQuantity_and_Tenor)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    try
    {
        subject_factory.Fx().Stream().Swap()
                .LiquidityProvider("CSFX")
                .CurrencyPair("EURGBP")
                .Currency("EUR")
                .NearQuantity(3500000)
                .NearSettlementDate(new Date(2018, 9, 15))
                .NearTenor(Tenor::IN_3_WEEKS)
                .CreateSubject()
                .ToString().c_str();
    }
    catch (InvalidSubjectException& e)
    {
        ASSERT_STREQ(e.what(), "subject is incomplete, missing: FarQuantity, FarTenor");
        return;
    }

    FAIL();
}